

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.hpp
# Opt level: O2

bool __thiscall cinatra::uri_t::is_websocket(uri_t *this)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  bool bVar1;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  
  __x._M_len = (this->schema)._M_len;
  __x._M_str = (this->schema)._M_str;
  __y._M_str = "ws";
  __y._M_len = 2;
  bVar1 = std::operator==(__x,__y);
  if (bVar1) {
    return true;
  }
  __x_00._M_len = (this->schema)._M_len;
  __x_00._M_str = (this->schema)._M_str;
  __y_00._M_str = "wss";
  __y_00._M_len = 3;
  bVar1 = std::operator==(__x_00,__y_00);
  return bVar1;
}

Assistant:

bool is_websocket() { return schema == "ws"sv || schema == "wss"sv; }